

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver.c
# Opt level: O2

receiver * init_receiver(char name,int num_ch,int ch_ofs)

{
  receiver *prVar1;
  filter *pfVar2;
  demod_state_t *d;
  
  prVar1 = (receiver *)hmalloc(0x38);
  prVar1->filter = (filter *)0x0;
  prVar1->name = '\0';
  *(undefined3 *)&prVar1->field_0x9 = 0;
  prVar1->lastbit = 0;
  prVar1->num_ch = 0;
  prVar1->ch_ofs = 0;
  prVar1->pll = 0;
  prVar1->pllinc = 0;
  prVar1->decoder = (demod_state_t *)0x0;
  *(undefined8 *)&prVar1->prev = 0;
  prVar1->last_levellog = 0;
  pfVar2 = filter_init(0x24,coeffs);
  prVar1->filter = pfVar2;
  d = (demod_state_t *)hmalloc(0x70);
  prVar1->decoder = d;
  protodec_initialize(d,(serial_state_t *)0x0,name);
  prVar1->name = name;
  prVar1->lastbit = 0;
  prVar1->num_ch = num_ch;
  prVar1->ch_ofs = ch_ofs;
  prVar1->pll = 0;
  prVar1->pllinc = 0x3333;
  prVar1->prev = 0;
  prVar1->last_levellog = 0;
  return prVar1;
}

Assistant:

struct receiver *init_receiver(char name, int num_ch, int ch_ofs)
{
	struct receiver *rx;

	rx = (struct receiver *) hmalloc(sizeof(struct receiver));
	memset(rx, 0, sizeof(struct receiver));

	rx->filter = filter_init(COEFFS_L, coeffs);

    rx->decoder = hmalloc(sizeof(struct demod_state_t));
	protodec_initialize(rx->decoder, NULL, name);

    rx->name = name;
	rx->lastbit = 0;
	rx->num_ch = num_ch;
	rx->ch_ofs = ch_ofs;
	rx->pll = 0;
	rx->pllinc = 0x10000 / 5;
	rx->prev = 0;
	rx->last_levellog = 0;

	return rx;
}